

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

int match(char *pat,char *str)

{
  int iVar1;
  size_t sVar2;
  char *__needle;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int local_cc;
  char *local_c8;
  char Xbuf [128];
  
  local_cc = 0x7f;
  local_c8 = (char *)0x0;
  __needle = Xbuf;
  iVar6 = 0;
  bVar7 = false;
  do {
    if (bVar7) {
      iVar6 = 1;
LAB_001044c2:
      free(local_c8);
      return iVar6;
    }
    if (pat[iVar6] == '\0') {
      iVar6 = 0;
      goto LAB_001044c2;
    }
    sVar2 = strcspn(pat + iVar6,",|");
    iVar5 = (int)sVar2;
    if (local_cc < iVar5) {
      local_cc = iVar5 + 0x80;
      __needle = (char *)realloc(local_c8,(ulong)(iVar5 + 0x81));
      local_c8 = __needle;
    }
    memcpy(__needle,pat + iVar6,(long)iVar5);
    __needle[iVar5] = '\0';
    if ((iVar5 < 1) || (__needle[iVar5 - 1] != '$')) {
      pcVar3 = strstr(str,__needle);
      bVar7 = pcVar3 != (char *)0x0;
    }
    else {
      sVar2 = strlen(str);
      uVar4 = iVar5 - 1;
      __needle[uVar4] = '\0';
      if ((int)sVar2 < (int)uVar4) {
        bVar7 = false;
      }
      else {
        iVar1 = strcmp(str + (int)((int)sVar2 - uVar4),__needle);
        bVar7 = iVar1 == 0;
      }
    }
    sVar2 = strspn(pat + (iVar6 + iVar5),",|");
    iVar6 = iVar6 + iVar5 + (int)sVar2;
  } while( true );
}

Assistant:

static int match (const char *pat, const char *str) {
	static const char seps[] = ",|";
	int found = 0;
	char Xbuf[128];
	int m = sizeof (Xbuf) - 1;
	char *mbuf = NULL;
	char *buf = Xbuf;
	int i = 0;
	while (!found && pat[i] != '\0') {
		int blen = strcspn (&pat[i], seps);
		int e = i + blen;
		if (blen > m) {
			m = blen + 128;
			buf = mbuf = (char *) realloc (mbuf, m + 1);
		}
		memcpy (buf, &pat[i], blen);
		buf[blen] = '\0';
		if (blen > 0 && buf[blen - 1] == '$') {
			int slen = strlen (str);
			buf[--blen] = 0;
			found = (slen >= blen &&
				 strcmp (&str[slen-blen], buf) == 0);
		} else {
			found = (strstr (str, buf) != NULL);
		}
		i = e + strspn (&pat[e], seps);
	}
	free (mbuf);
	return (found);
}